

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream * QtPrivate::writeSequentialContainer<QList<QSize>>(QDataStream *s,QList<QSize> *c)

{
  bool bVar1;
  const_iterator o;
  QSize *pQVar2;
  QList<QSize> *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  value_type *t;
  QList<QSize> *__range2;
  const_iterator __end0;
  const_iterator __begin0;
  QDataStream *in_stack_ffffffffffffffa8;
  QDataStream *this;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QList<QSize>::size(in_RSI);
  bVar1 = QDataStream::writeQSizeType(in_stack_ffffffffffffffa8,0x27a271);
  if (bVar1) {
    local_10.i = (QSize *)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QSize>::begin((QList<QSize> *)this);
    o = QList<QSize>::end((QList<QSize> *)this);
    while (bVar1 = QList<QSize>::const_iterator::operator!=(&local_10,o), bVar1) {
      pQVar2 = QList<QSize>::const_iterator::operator*(&local_10);
      ::operator<<(in_RDI,(QSize *)pQVar2);
      QList<QSize>::const_iterator::operator++(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}